

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
xemmai::t_parser::f_expressions
          (t_parser *this,size_t a_indent,
          vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
          *a_nodes)

{
  t_token tVar1;
  bool bVar2;
  _Head_base<0UL,_xemmai::ast::t_node_*,_false> in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_xemmai::ast::t_node_*,_false> local_38;
  
  tVar1 = (this->v_lexer).v_token;
  local_38._M_head_impl = in_RAX._M_head_impl;
  do {
    bVar2 = tVar1 == c_token__ASTERISK;
    if (bVar2) {
      t_lexer::f_next(&this->v_lexer);
      f_expression((t_parser *)&stack0xffffffffffffffc8);
      std::
      vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
      ::emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                  *)a_nodes,
                 (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                 &stack0xffffffffffffffc8);
      if ((tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)
          local_38._M_head_impl != (_Head_base<0UL,_xemmai::ast::t_node_*,_false>)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
      return bVar2;
    }
    f_expression((t_parser *)&stack0xffffffffffffffc8);
    std::
    vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
    ::emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
              ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                *)a_nodes,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               &stack0xffffffffffffffc8);
    if (local_38._M_head_impl != (t_node *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if ((this->v_lexer).v_token == c_token__COMMA) {
      if (((this->v_lexer).v_newline == true) &&
         ((ulong)((long)(this->v_lexer).v_indent.v_i + (-0x50 - (long)(this->v_lexer).v_indent.v_p)
                 >> 2) < a_indent)) {
        return bVar2;
      }
      t_lexer::f_next(&this->v_lexer);
    }
    else {
      if ((this->v_lexer).v_newline != true) {
        return bVar2;
      }
      if ((ulong)((long)(this->v_lexer).v_indent.v_i + (-0x50 - (long)(this->v_lexer).v_indent.v_p)
                 >> 2) <= a_indent) {
        return bVar2;
      }
    }
    tVar1 = (this->v_lexer).v_token;
  } while( true );
}

Assistant:

bool t_parser::f_expressions(size_t a_indent, std::vector<std::unique_ptr<ast::t_node>>& a_nodes)
{
	while (v_lexer.f_token() != t_lexer::c_token__ASTERISK) {
		a_nodes.push_back(f_expression());
		if (v_lexer.f_token() == t_lexer::c_token__COMMA) {
			if (v_lexer.f_newline() && v_lexer.f_indent() < a_indent) return false;
			v_lexer.f_next();
			continue;
		}
		if (!v_lexer.f_newline() || v_lexer.f_indent() <= a_indent) return false;
	}
	v_lexer.f_next();
	a_nodes.push_back(f_expression());
	return true;
}